

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instantiate_template_headers.hpp
# Opt level: O3

void impute_missing_values
               (double *numeric_data,int *categ_data,bool is_col_major,double *Xr,int *Xr_ind,
               int *Xr_indptr,size_t nrows,bool use_long_double,int nthreads,
               IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,Imputer *imputer)

{
  if (use_long_double) {
    impute_missing_values_internal<double,int,long_double>
              (numeric_data,categ_data,is_col_major,Xr,Xr_ind,Xr_indptr,nrows,nthreads,model_outputs
               ,model_outputs_ext,imputer);
  }
  else {
    impute_missing_values_internal<double,int,double>
              (numeric_data,categ_data,is_col_major,Xr,Xr_ind,Xr_indptr,nrows,nthreads,model_outputs
               ,model_outputs_ext,imputer);
  }
  return;
}

Assistant:

ISOTREE_EXPORTED void impute_missing_values(real_t numeric_data[], int categ_data[], bool is_col_major,
                           real_t Xr[], sparse_ix Xr_ind[], sparse_ix Xr_indptr[],
                           size_t nrows, bool use_long_double, int nthreads,
                           IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                           Imputer &imputer)
{
    impute_missing_values<real_t, sparse_ix>
                          (numeric_data, categ_data, is_col_major,
                           Xr, Xr_ind, Xr_indptr,
                           nrows, use_long_double, nthreads,
                           model_outputs, model_outputs_ext,
                           imputer);
}